

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horizontalbitpacking.cpp
# Opt level: O3

void FastPForLib::simdhunpack(uint8_t *in,uint32_t *out,uint32_t bit)

{
  undefined1 (*pauVar1) [16];
  undefined8 *puVar2;
  uint8_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  uint32_t j;
  long lVar7;
  logic_error *this;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  
  auVar31 = _DAT_00156880;
  auVar16 = _DAT_00156870;
  auVar23 = _DAT_00156850;
  auVar5 = _DAT_00156840;
  auVar4 = _DAT_00156830;
  auVar27 = _DAT_00156820;
  auVar33 = _DAT_00156810;
  auVar36 = _DAT_00156800;
  auVar28 = _DAT_001567e0;
  auVar14 = _DAT_001567c0;
  auVar30 = _DAT_001567b0;
  auVar35 = _DAT_00156790;
  auVar37 = _DAT_00156770;
  auVar44 = _DAT_00156750;
  auVar49 = _DAT_00156730;
  auVar8 = _DAT_00156710;
  auVar46 = _DAT_00156700;
  auVar42 = _DAT_001566d0;
  auVar41 = _DAT_001566b0;
  auVar26 = _DAT_00156690;
  auVar9 = _DAT_00156680;
  auVar15 = _DAT_00156640;
  switch(bit) {
  case 0:
    auVar43 = ZEXT1664((undefined1  [16])0x0);
    auVar38 = vmovdqu64_avx512f(auVar43);
    *(undefined1 (*) [64])(out + 0x70) = auVar38;
    auVar38 = vmovdqu64_avx512f(auVar43);
    *(undefined1 (*) [64])(out + 0x60) = auVar38;
    auVar38 = vmovdqu64_avx512f(auVar43);
    *(undefined1 (*) [64])(out + 0x50) = auVar38;
    auVar38 = vmovdqu64_avx512f(auVar43);
    *(undefined1 (*) [64])(out + 0x40) = auVar38;
    auVar38 = vmovdqu64_avx512f(auVar43);
    *(undefined1 (*) [64])(out + 0x30) = auVar38;
    auVar38 = vmovdqu64_avx512f(auVar43);
    *(undefined1 (*) [64])(out + 0x20) = auVar38;
    auVar38 = vmovdqu64_avx512f(auVar43);
    *(undefined1 (*) [64])(out + 0x10) = auVar38;
    auVar38 = vmovdqu64_avx512f(auVar43);
    *(undefined1 (*) [64])out = auVar38;
    break;
  case 1:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar13._8_8_ = 0x100000001;
    auVar13._0_8_ = 0x100000001;
    auVar9 = vpmovsxbd_avx(ZEXT416(0x7060504));
    lVar7 = 0;
    do {
      uVar3 = in[lVar7];
      auVar39[1] = uVar3;
      auVar39[0] = uVar3;
      auVar39[2] = uVar3;
      auVar39[3] = uVar3;
      auVar39[4] = uVar3;
      auVar39[5] = uVar3;
      auVar39[6] = uVar3;
      auVar39[7] = uVar3;
      auVar39[8] = uVar3;
      auVar39[9] = uVar3;
      auVar39[10] = uVar3;
      auVar39[0xb] = uVar3;
      auVar39[0xc] = uVar3;
      auVar39[0xd] = uVar3;
      auVar39[0xe] = uVar3;
      auVar39[0xf] = uVar3;
      auVar26 = vpsrlvd_avx2(auVar39,auVar15);
      auVar26 = vpand_avx(auVar26,auVar13);
      *(undefined1 (*) [16])out = auVar26;
      uVar3 = in[lVar7];
      auVar40[1] = uVar3;
      auVar40[0] = uVar3;
      auVar40[2] = uVar3;
      auVar40[3] = uVar3;
      auVar40[4] = uVar3;
      auVar40[5] = uVar3;
      auVar40[6] = uVar3;
      auVar40[7] = uVar3;
      auVar40[8] = uVar3;
      auVar40[9] = uVar3;
      auVar40[10] = uVar3;
      auVar40[0xb] = uVar3;
      auVar40[0xc] = uVar3;
      auVar40[0xd] = uVar3;
      auVar40[0xe] = uVar3;
      auVar40[0xf] = uVar3;
      lVar7 = lVar7 + 1;
      auVar26 = vpsrlvd_avx2(auVar40,auVar9);
      auVar26 = vpand_avx(auVar26,auVar13);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar26;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x10);
    break;
  case 2:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x6040200));
    auVar12._8_8_ = 0x300000003;
    auVar12._0_8_ = 0x300000003;
    lVar7 = 0;
    do {
      uVar3 = in[lVar7 * 2];
      auVar21[1] = uVar3;
      auVar21[0] = uVar3;
      auVar21[2] = uVar3;
      auVar21[3] = uVar3;
      auVar21[4] = uVar3;
      auVar21[5] = uVar3;
      auVar21[6] = uVar3;
      auVar21[7] = uVar3;
      auVar21[8] = uVar3;
      auVar21[9] = uVar3;
      auVar21[10] = uVar3;
      auVar21[0xb] = uVar3;
      auVar21[0xc] = uVar3;
      auVar21[0xd] = uVar3;
      auVar21[0xe] = uVar3;
      auVar21[0xf] = uVar3;
      auVar9 = vpsrlvd_avx2(auVar21,auVar15);
      auVar9 = vpand_avx(auVar9,auVar12);
      *(undefined1 (*) [16])out = auVar9;
      uVar3 = in[lVar7 * 2 + 1];
      auVar22[1] = uVar3;
      auVar22[0] = uVar3;
      auVar22[2] = uVar3;
      auVar22[3] = uVar3;
      auVar22[4] = uVar3;
      auVar22[5] = uVar3;
      auVar22[6] = uVar3;
      auVar22[7] = uVar3;
      auVar22[8] = uVar3;
      auVar22[9] = uVar3;
      auVar22[10] = uVar3;
      auVar22[0xb] = uVar3;
      auVar22[0xc] = uVar3;
      auVar22[0xd] = uVar3;
      auVar22[0xe] = uVar3;
      auVar22[0xf] = uVar3;
      lVar7 = lVar7 + 1;
      auVar9 = vpsrlvd_avx2(auVar22,auVar15);
      auVar9 = vpand_avx(auVar9,auVar12);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar9;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x10);
    break;
  case 3:
    auVar26 = vpmovzxwd_avx(ZEXT816(0x8001010080008000));
    auVar15 = vpmovsxbd_avx(ZEXT416(0x1060300));
    auVar24._8_8_ = 0x700000007;
    auVar24._0_8_ = 0x700000007;
    auVar41 = vpmovzxwd_avx(ZEXT816(0x8001800101008000));
    auVar9 = vpmovsxbd_avx(ZEXT416(0x5020704));
    lVar7 = 1;
    do {
      auVar42 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -1),auVar26);
      auVar42 = vpsrlvd_avx2(auVar42,auVar15);
      auVar42 = vpand_avx(auVar42,auVar24);
      *(undefined1 (*) [16])out = auVar42;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 3;
      auVar42 = vpshufb_avx(*pauVar1,auVar41);
      auVar42 = vpsrlvd_avx2(auVar42,auVar9);
      auVar42 = vpand_avx(auVar42,auVar24);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar42;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x31);
    break;
  case 4:
    auVar15 = vpmovsxbw_avx(ZEXT816(0x301030101000100));
    auVar10._8_8_ = 0x400000000;
    auVar10._0_8_ = 0x400000000;
    auVar18._8_8_ = 0xf0000000f;
    auVar18._0_8_ = 0xf0000000f;
    lVar7 = 0;
    do {
      auVar9 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7),auVar15);
      auVar9 = vpsrlvd_avx2(auVar9,auVar10);
      auVar9 = vpand_avx(auVar9,auVar18);
      *(undefined1 (*) [16])(out + lVar7 * 2) = auVar9;
      auVar9 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + 2),auVar15);
      auVar9 = vpsrlvd_avx2(auVar9,auVar10);
      auVar9 = vpand_avx(auVar9,auVar18);
      *(undefined1 (*) [16])(out + lVar7 * 2 + 4) = auVar9;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x40);
    break;
  case 5:
    auVar26 = vpmovzxwd_avx(ZEXT816(0x201800101008000));
    auVar15 = vpmovsxbd_avx(ZEXT416(0x7020500));
    auVar29._8_8_ = 0x1f0000001f;
    auVar29._0_8_ = 0x1f0000001f;
    auVar41 = vpmovzxwd_avx(ZEXT816(0x8002020180010100));
    auVar9 = vpmovsxbd_avx(ZEXT416(0x3060104));
    lVar7 = 2;
    do {
      auVar42 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -2),auVar26);
      auVar42 = vpsrlvd_avx2(auVar42,auVar15);
      auVar42 = vpand_avx(auVar42,auVar29);
      *(undefined1 (*) [16])out = auVar42;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 5;
      auVar42 = vpshufb_avx(*pauVar1,auVar41);
      auVar42 = vpsrlvd_avx2(auVar42,auVar9);
      auVar42 = vpand_avx(auVar42,auVar29);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar42;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x52);
    break;
  case 6:
    auVar9 = vpmovzxwd_avx(ZEXT816(0x8002020101008000));
    auVar15 = vpmovsxbd_avx(ZEXT416(0x2040600));
    auVar32._8_8_ = 0x3f0000003f;
    auVar32._0_8_ = 0x3f0000003f;
    lVar7 = 3;
    do {
      auVar26 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -3),auVar9);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar32);
      *(undefined1 (*) [16])out = auVar26;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 6;
      auVar26 = vpshufb_avx(*pauVar1,auVar9);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar32);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar26;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 99);
    break;
  case 7:
    auVar26 = vpmovzxwd_avx(ZEXT816(0x302020101008000));
    auVar15 = vpmovsxbd_avx(ZEXT416(0x5060700));
    auVar25._8_8_ = 0x7f0000007f;
    auVar25._0_8_ = 0x7f0000007f;
    auVar41 = vpmovzxwd_avx(ZEXT816(0x8003030202010100));
    auVar9 = vpmovsxbd_avx(ZEXT416(0x1020304));
    lVar7 = 3;
    do {
      auVar42 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -3),auVar26);
      auVar42 = vpsrlvd_avx2(auVar42,auVar15);
      auVar42 = vpand_avx(auVar42,auVar25);
      *(undefined1 (*) [16])out = auVar42;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 7;
      auVar42 = vpshufb_avx(*pauVar1,auVar41);
      auVar42 = vpsrlvd_avx2(auVar42,auVar9);
      auVar42 = vpand_avx(auVar42,auVar25);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar42;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x73);
    break;
  case 8:
    lVar7 = 0;
    do {
      auVar15 = vpmovzxbd_avx(ZEXT416(*(uint *)(in + lVar7)));
      *(undefined1 (*) [16])(out + lVar7) = auVar15;
      auVar15 = vpmovzxbd_avx(ZEXT416(*(uint *)(in + lVar7 + 4)));
      *(undefined1 (*) [16])(out + lVar7 + 4) = auVar15;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x80);
    break;
  case 9:
    auVar26 = vpmovsxwd_avx(ZEXT816(0x403030202010100));
    auVar15 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar20._8_8_ = 0x1ff000001ff;
    auVar20._0_8_ = 0x1ff000001ff;
    auVar9 = vpmovsxbd_avx(ZEXT416(0x7060504));
    lVar7 = 4;
    do {
      auVar41 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -4),auVar26);
      auVar41 = vpsrlvd_avx2(auVar41,auVar15);
      auVar41 = vpand_avx(auVar41,auVar20);
      *(undefined1 (*) [16])out = auVar41;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 9;
      auVar41 = vpshufb_avx(*pauVar1,auVar26);
      auVar41 = vpsrlvd_avx2(auVar41,auVar9);
      auVar41 = vpand_avx(auVar41,auVar20);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar41;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x94);
    break;
  case 10:
    auVar9 = vpmovsxwd_avx(ZEXT816(0x403030202010100));
    auVar15 = vpmovsxbd_avx(ZEXT416(0x6040200));
    auVar34._8_8_ = 0x3ff000003ff;
    auVar34._0_8_ = 0x3ff000003ff;
    lVar7 = 5;
    do {
      auVar26 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -5),auVar9);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar34);
      *(undefined1 (*) [16])out = auVar26;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 10;
      auVar26 = vpshufb_avx(*pauVar1,auVar9);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar34);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar26;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0xa5);
    break;
  case 0xb:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x1060300));
    auVar17._8_8_ = 0x7ff000007ff;
    auVar17._0_8_ = 0x7ff000007ff;
    auVar9 = vpmovsxbd_avx(ZEXT416(0x5020704));
    lVar7 = 5;
    do {
      auVar26 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -5),auVar16);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar17);
      *(undefined1 (*) [16])out = auVar26;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0xb;
      auVar26 = vpshufb_avx(*pauVar1,auVar31);
      auVar26 = vpsrlvd_avx2(auVar26,auVar9);
      auVar26 = vpand_avx(auVar26,auVar17);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar26;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0xb5);
    break;
  case 0xc:
    auVar15 = vpmovsxwd_avx(ZEXT816(0x504040302010100));
    auVar11._8_8_ = 0x400000000;
    auVar11._0_8_ = 0x400000000;
    auVar19._8_8_ = 0xfff00000fff;
    auVar19._0_8_ = 0xfff00000fff;
    lVar7 = 6;
    do {
      auVar9 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -6),auVar15);
      auVar9 = vpsrlvd_avx2(auVar9,auVar11);
      auVar9 = vpand_avx(auVar9,auVar19);
      *(undefined1 (*) [16])out = auVar9;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0xc;
      auVar9 = vpshufb_avx(*pauVar1,auVar15);
      auVar9 = vpsrlvd_avx2(auVar9,auVar11);
      auVar9 = vpand_avx(auVar9,auVar19);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar9;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0xc6);
    break;
  case 0xd:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x7020500));
    auVar31._8_8_ = 0x1fff00001fff;
    auVar31._0_8_ = 0x1fff00001fff;
    auVar9 = vpmovsxbd_avx(ZEXT416(0x3060104));
    lVar7 = 6;
    do {
      auVar26 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -6),auVar5);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar31);
      *(undefined1 (*) [16])out = auVar26;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0xd;
      auVar26 = vpshufb_avx(*pauVar1,auVar23);
      auVar26 = vpsrlvd_avx2(auVar26,auVar9);
      auVar26 = vpand_avx(auVar26,auVar31);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar26;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0xd6);
    break;
  case 0xe:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x2040600));
    auVar16._8_8_ = 0x3fff00003fff;
    auVar16._0_8_ = 0x3fff00003fff;
    lVar7 = 7;
    do {
      auVar9 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -7),auVar4);
      auVar9 = vpsrlvd_avx2(auVar9,auVar15);
      auVar9 = vpand_avx(auVar9,auVar16);
      *(undefined1 (*) [16])out = auVar9;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0xe;
      auVar9 = vpshufb_avx(*pauVar1,auVar4);
      auVar9 = vpsrlvd_avx2(auVar9,auVar15);
      auVar9 = vpand_avx(auVar9,auVar16);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar9;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0xe7);
    break;
  case 0xf:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x5060700));
    auVar23._8_8_ = 0x7fff00007fff;
    auVar23._0_8_ = 0x7fff00007fff;
    auVar9 = vpmovsxbd_avx(ZEXT416(0x1020304));
    lVar7 = 7;
    do {
      auVar26 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -7),auVar33);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar23);
      *(undefined1 (*) [16])out = auVar26;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0xf;
      auVar26 = vpshufb_avx(*pauVar1,auVar27);
      auVar26 = vpsrlvd_avx2(auVar26,auVar9);
      auVar26 = vpand_avx(auVar26,auVar23);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar26;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0xf7);
    break;
  case 0x10:
    lVar7 = 0;
    do {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(in + lVar7);
      auVar15 = vpmovzxwd_avx(auVar4);
      *(undefined1 (*) [16])((long)out + lVar7 * 2) = auVar15;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(in + lVar7 + 8);
      auVar15 = vpmovzxwd_avx(auVar5);
      *(undefined1 (*) [16])((long)out + lVar7 * 2 + 0x10) = auVar15;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x100);
    break;
  case 0x11:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar27._8_8_ = 0x1ffff0001ffff;
    auVar27._0_8_ = 0x1ffff0001ffff;
    auVar9 = vpmovsxbd_avx(ZEXT416(0x7060504));
    lVar7 = 8;
    do {
      auVar26 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -8),auVar36);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar27);
      *(undefined1 (*) [16])out = auVar26;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x11;
      auVar26 = vpshufb_avx(*pauVar1,auVar36);
      auVar26 = vpsrlvd_avx2(auVar26,auVar9);
      auVar26 = vpand_avx(auVar26,auVar27);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar26;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x118);
    break;
  case 0x12:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x6040200));
    auVar33._8_8_ = 0x3ffff0003ffff;
    auVar33._0_8_ = 0x3ffff0003ffff;
    lVar7 = 9;
    do {
      auVar9 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -9),auVar36);
      auVar9 = vpsrlvd_avx2(auVar9,auVar15);
      auVar9 = vpand_avx(auVar9,auVar33);
      *(undefined1 (*) [16])out = auVar9;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x12;
      auVar9 = vpshufb_avx(*pauVar1,auVar36);
      auVar9 = vpsrlvd_avx2(auVar9,auVar15);
      auVar9 = vpand_avx(auVar9,auVar33);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar9;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x129);
    break;
  case 0x13:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x1060300));
    auVar36._8_8_ = 0x7ffff0007ffff;
    auVar36._0_8_ = 0x7ffff0007ffff;
    auVar9 = vpmovsxbd_avx(ZEXT416(0x5020704));
    lVar7 = 9;
    do {
      auVar26 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -9),auVar14);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar36);
      *(undefined1 (*) [16])out = auVar26;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x13;
      auVar26 = vpshufb_avx(*pauVar1,auVar28);
      auVar26 = vpsrlvd_avx2(auVar26,auVar9);
      auVar26 = vpand_avx(auVar26,auVar36);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar26;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x139);
    break;
  case 0x14:
    auVar14._8_8_ = 0x400000000;
    auVar14._0_8_ = 0x400000000;
    auVar28._8_8_ = 0xfffff000fffff;
    auVar28._0_8_ = 0xfffff000fffff;
    lVar7 = 10;
    do {
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -10),auVar30);
      auVar15 = vpsrlvd_avx2(auVar15,auVar14);
      auVar15 = vpand_avx(auVar15,auVar28);
      *(undefined1 (*) [16])out = auVar15;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x14;
      auVar15 = vpshufb_avx(*pauVar1,auVar30);
      auVar15 = vpsrlvd_avx2(auVar15,auVar14);
      auVar15 = vpand_avx(auVar15,auVar28);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar15;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x14a);
    break;
  case 0x15:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x7020500));
    auVar30._8_8_ = 0x1fffff001fffff;
    auVar30._0_8_ = 0x1fffff001fffff;
    auVar9 = vpmovsxbd_avx(ZEXT416(0x3060104));
    lVar7 = 10;
    do {
      auVar26 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -10),auVar37);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar30);
      *(undefined1 (*) [16])out = auVar26;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x15;
      auVar26 = vpshufb_avx(*pauVar1,auVar35);
      auVar26 = vpsrlvd_avx2(auVar26,auVar9);
      auVar26 = vpand_avx(auVar26,auVar30);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar26;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x15a);
    break;
  case 0x16:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x2040600));
    auVar35._8_8_ = 0x3fffff003fffff;
    auVar35._0_8_ = 0x3fffff003fffff;
    lVar7 = 0xb;
    do {
      auVar9 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -0xb),auVar44);
      auVar9 = vpsrlvd_avx2(auVar9,auVar15);
      auVar9 = vpand_avx(auVar9,auVar35);
      *(undefined1 (*) [16])out = auVar9;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x16;
      auVar9 = vpshufb_avx(*pauVar1,auVar44);
      auVar9 = vpsrlvd_avx2(auVar9,auVar15);
      auVar9 = vpand_avx(auVar9,auVar35);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar9;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x16b);
    break;
  case 0x17:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x5060700));
    auVar37._8_8_ = 0x7fffff007fffff;
    auVar37._0_8_ = 0x7fffff007fffff;
    auVar9 = vpmovsxbd_avx(ZEXT416(0x1020304));
    lVar7 = 0xb;
    do {
      auVar26 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -0xb),auVar8);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar37);
      *(undefined1 (*) [16])out = auVar26;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x17;
      auVar26 = vpshufb_avx(*pauVar1,auVar49);
      auVar26 = vpsrlvd_avx2(auVar26,auVar9);
      auVar26 = vpand_avx(auVar26,auVar37);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar26;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x17b);
    break;
  case 0x18:
    lVar7 = 0xc;
    do {
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -0xc),auVar46);
      *(undefined1 (*) [16])out = auVar15;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x18;
      auVar15 = vpshufb_avx(*pauVar1,auVar46);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar15;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x18c);
    break;
  case 0x19:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar49._8_8_ = 0x1ffffff01ffffff;
    auVar49._0_8_ = 0x1ffffff01ffffff;
    auVar9 = vpmovsxbd_avx(ZEXT416(0x7060504));
    auVar44._8_4_ = 0x1ffffff;
    auVar44._0_8_ = 0x1ffffff01ffffff;
    auVar44._12_4_ = 0x1ffffff;
    lVar7 = 0xc;
    do {
      auVar26 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -0xc),auVar42);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar49);
      *(undefined1 (*) [16])out = auVar26;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x19;
      auVar26 = vpshufb_avx(*pauVar1,auVar42);
      auVar26 = vpsrlvd_avx2(auVar26,auVar9);
      auVar26 = vpand_avx(auVar26,auVar44);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar26;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x19c);
    break;
  case 0x1a:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x6040200));
    auVar8._8_4_ = 0x3ffffff;
    auVar8._0_8_ = 0x3ffffff03ffffff;
    auVar8._12_4_ = 0x3ffffff;
    lVar7 = 0xd;
    do {
      auVar9 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -0xd),auVar42);
      auVar9 = vpsrlvd_avx2(auVar9,auVar15);
      auVar9 = vpand_avx(auVar9,auVar8);
      *(undefined1 (*) [16])out = auVar9;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x1a;
      auVar9 = vpshufb_avx(*pauVar1,auVar42);
      auVar9 = vpsrlvd_avx2(auVar9,auVar15);
      auVar9 = vpand_avx(auVar9,auVar8);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar9;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x1ad);
    break;
  case 0x1b:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x1000300));
    auVar42._8_8_ = 0x7ffffff07ffffff;
    auVar42._0_8_ = 0x7ffffff07ffffff;
    auVar9 = vpmovsxbd_avx(ZEXT416(0x5020004));
    auVar46._8_4_ = 0x7ffffff;
    auVar46._0_8_ = 0x7ffffff07ffffff;
    auVar46._12_4_ = 0x7ffffff;
    lVar7 = 0xd;
    do {
      auVar8 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -0xd),auVar26);
      auVar49 = vpsrlq_avx(auVar8,6);
      auVar8 = vpblendd_avx2(auVar8,auVar49,4);
      auVar8 = vpsrlvd_avx2(auVar8,auVar15);
      auVar8 = vpand_avx(auVar8,auVar42);
      *(undefined1 (*) [16])out = auVar8;
      auVar8 = *(undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x1b;
      auVar49 = vpaddq_avx(auVar8,auVar8);
      auVar8 = vpermt2b_avx512vl(auVar8,auVar41,auVar49);
      auVar8 = vpsrlvd_avx2(auVar8,auVar9);
      auVar8 = vpand_avx(auVar8,auVar46);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar8;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x1bd);
    break;
  case 0x1c:
    auVar15._8_8_ = 0x400000000;
    auVar15._0_8_ = 0x400000000;
    auVar41._8_4_ = 0xfffffff;
    auVar41._0_8_ = 0xfffffff0fffffff;
    auVar41._12_4_ = 0xfffffff;
    lVar7 = 0xe;
    do {
      auVar26 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -0xe),auVar9);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar41);
      *(undefined1 (*) [16])out = auVar26;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x1c;
      auVar26 = vpshufb_avx(*pauVar1,auVar9);
      auVar26 = vpsrlvd_avx2(auVar26,auVar15);
      auVar26 = vpand_avx(auVar26,auVar41);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar26;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x1ce);
    break;
  case 0x1d:
    auVar15 = vpmovsxbd_avx(ZEXT416(0x2020000));
    auVar38 = ZEXT1664(auVar15);
    auVar43 = ZEXT1664(CONCAT88(0x1fffffff1fffffff,0x1fffffff1fffffff));
    auVar45 = ZEXT1664(_DAT_00156660);
    auVar15 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar47 = ZEXT1664(auVar15);
    auVar48 = ZEXT1664(CONCAT412(0x1fffffff,CONCAT48(0x1fffffff,0x1fffffff1fffffff)));
    lVar7 = 0xe;
    do {
      auVar15 = *(undefined1 (*) [16])(in + lVar7 + -0xe);
      if (simdhunpack29(unsigned_char_const*,unsigned_int*)::x2 == '\0') {
        simdhunpack();
        auVar48 = ZEXT1664(CONCAT412(0x1fffffff,CONCAT48(0x1fffffff,0x1fffffff1fffffff)));
        auVar9 = vpmovsxbd_avx(ZEXT416(0x3020100));
        auVar47 = ZEXT1664(auVar9);
        auVar45 = ZEXT1664(_DAT_00156660);
        auVar43 = ZEXT1664(CONCAT88(0x1fffffff1fffffff,0x1fffffff1fffffff));
        auVar9 = vpmovsxbd_avx(ZEXT416(0x2020000));
        auVar38 = ZEXT1664(auVar9);
      }
      auVar9 = vpsllq_avx(auVar15,3);
      auVar9 = vpblendw_avx(auVar9,auVar15,0x13);
      auVar9 = vpshufb_avx(auVar9,simdhunpack29(unsigned_char_const*,unsigned_int*)::x2);
      if (simdhunpack29(unsigned_char_const*,unsigned_int*)::x1 == '\0') {
        simdhunpack();
        auVar48 = ZEXT1664(CONCAT412(0x1fffffff,CONCAT48(0x1fffffff,0x1fffffff1fffffff)));
        auVar26 = vpmovsxbd_avx(ZEXT416(0x3020100));
        auVar47 = ZEXT1664(auVar26);
        auVar45 = ZEXT1664(_DAT_00156660);
        auVar43 = ZEXT1664(CONCAT88(0x1fffffff1fffffff,0x1fffffff1fffffff));
        auVar26 = vpmovsxbd_avx(ZEXT416(0x2020000));
        auVar38 = ZEXT1664(auVar26);
      }
      auVar15 = vpshufb_avx(auVar15,simdhunpack29(unsigned_char_const*,unsigned_int*)::x1);
      auVar15 = vpblendd_avx2(auVar15,auVar9,10);
      auVar15 = vpsrlvd_avx2(auVar15,auVar38._0_16_);
      auVar15 = vpand_avx(auVar15,auVar43._0_16_);
      *(undefined1 (*) [16])out = auVar15;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x1d;
      auVar15 = vpshufb_avx(*pauVar1,auVar45._0_16_);
      auVar9 = vpsrlq_avx(auVar15,4);
      auVar15 = vpblendd_avx2(auVar9,auVar15,10);
      auVar15 = vpsrlvd_avx2(auVar15,auVar47._0_16_);
      auVar15 = vpand_avx(auVar15,auVar48._0_16_);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar15;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x1de);
    break;
  case 0x1e:
    auVar9._8_8_ = 0x200000000;
    auVar9._0_8_ = 0x200000000;
    auVar26._8_4_ = 0x3fffffff;
    auVar26._0_8_ = 0x3fffffff3fffffff;
    auVar26._12_4_ = 0x3fffffff;
    lVar7 = 0xf;
    do {
      auVar41 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar7 + -0xf),auVar15);
      auVar42 = vpsllq_avx(*(undefined1 (*) [16])(in + lVar7 + -0xf),4);
      auVar46 = vpsrlq_avx(auVar41,4);
      auVar41 = vpblendd_avx2(auVar41,auVar46,4);
      auVar41 = vpblendd_avx2(auVar41,auVar42,2);
      auVar41 = vpsrlvd_avx2(auVar41,auVar9);
      auVar41 = vpand_avx(auVar41,auVar26);
      *(undefined1 (*) [16])out = auVar41;
      pauVar1 = (undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x1e;
      auVar41 = vpshufb_avx(*pauVar1,auVar15);
      auVar42 = vpsllq_avx(*pauVar1,4);
      auVar46 = vpsrlq_avx(auVar41,4);
      auVar41 = vpblendd_avx2(auVar41,auVar46,4);
      auVar41 = vpblendd_avx2(auVar41,auVar42,2);
      auVar41 = vpsrlvd_avx2(auVar41,auVar9);
      auVar41 = vpand_avx(auVar41,auVar26);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar41;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x1ef);
    break;
  case 0x1f:
    if (simdhunpack31(unsigned_char_const*,unsigned_int*)::mask == '\0') {
      simdhunpack();
    }
    auVar15 = simdhunpack31(unsigned_char_const*,unsigned_int*)::mask;
    lVar7 = 0xf;
    do {
      auVar9 = *(undefined1 (*) [16])(in + lVar7 + -0xf);
      auVar26 = vpaddq_avx(auVar9,auVar9);
      auVar41 = vpslldq_avx(auVar9,1);
      auVar26 = vpblendd_avx2(auVar9,auVar26,2);
      auVar42 = vpsrlq_avx(auVar41,6);
      auVar41 = vpsllq_avx(auVar9,3);
      auVar9 = vpblendd_avx2(auVar26,auVar42,0xc);
      auVar9 = vpblendd_avx2(auVar9,auVar41,8);
      auVar9 = vpand_avx(auVar15,auVar9);
      *(undefined1 (*) [16])out = auVar9;
      auVar9 = *(undefined1 (*) [16])(in + lVar7);
      lVar7 = lVar7 + 0x1f;
      auVar41 = vpsrldq_avx(auVar9,1);
      auVar26 = vpsrlq_avx(auVar9,4);
      auVar41 = vpsllq_avx(auVar41,5);
      auVar26 = vpblendd_avx2(auVar26,auVar41,2);
      auVar42 = vpsrlq_avx(auVar9,2);
      auVar41 = vpsrlq_avx(auVar9,1);
      auVar9 = vpblendd_avx2(auVar26,auVar42,0xc);
      auVar9 = vpblendd_avx2(auVar9,auVar41,8);
      auVar9 = vpand_avx(auVar15,auVar9);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar9;
      out = (uint32_t *)((long)out + 0x20);
    } while (lVar7 != 0x1ff);
    break;
  case 0x20:
    lVar7 = 0;
    do {
      uVar6 = *(undefined8 *)(in + lVar7 + 8);
      *(undefined8 *)((long)out + lVar7) = *(undefined8 *)(in + lVar7);
      ((undefined8 *)((long)out + lVar7))[1] = uVar6;
      uVar6 = *(undefined8 *)(in + lVar7 + 0x10 + 8);
      puVar2 = (undefined8 *)((long)out + lVar7 + 0x10);
      *puVar2 = *(undefined8 *)(in + lVar7 + 0x10);
      puVar2[1] = uVar6;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x200);
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"number of bits is unsupported");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void simdhunpack(const uint8_t *in, uint32_t *out, uint32_t bit) {
  switch (bit) {
  case 0:
    SIMD_nullunpacker32(in, out);
    return;

  case 1:
    simdhunpack1(in, out);
    return;

  case 2:
    simdhunpack2(in, out);
    return;

  case 3:
    simdhunpack3(in, out);
    return;

  case 4:
    simdhunpack4(in, out);
    return;

  case 5:
    simdhunpack5(in, out);
    return;

  case 6:
    simdhunpack6(in, out);
    return;

  case 7:
    simdhunpack7(in, out);
    return;

  case 8:
    simdhunpack8(in, out);
    return;

  case 9:
    simdhunpack9(in, out);
    return;

  case 10:
    simdhunpack10(in, out);
    return;

  case 11:
    simdhunpack11(in, out);
    return;

  case 12:
    simdhunpack12(in, out);
    return;

  case 13:
    simdhunpack13(in, out);
    return;

  case 14:
    simdhunpack14(in, out);
    return;

  case 15:
    simdhunpack15(in, out);
    return;

  case 16:
    simdhunpack16(in, out);
    return;

  case 17:
    simdhunpack17(in, out);
    return;

  case 18:
    simdhunpack18(in, out);
    return;

  case 19:
    simdhunpack19(in, out);
    return;

  case 20:
    simdhunpack20(in, out);
    return;

  case 21:
    simdhunpack21(in, out);
    return;

  case 22:
    simdhunpack22(in, out);
    return;

  case 23:
    simdhunpack23(in, out);
    return;

  case 24:
    simdhunpack24(in, out);
    return;

  case 25:
    simdhunpack25(in, out);
    return;

  case 26:
    simdhunpack26(in, out);
    return;

  case 27:
    simdhunpack27(in, out);
    return;

  case 28:
    simdhunpack28(in, out);
    return;

  case 29:
    simdhunpack29(in, out);
    return;

  case 30:
    simdhunpack30(in, out);
    return;

  case 31:
    simdhunpack31(in, out);
    return;

  case 32:
    simdhunpack32(in, out);
    return;

  default:
    break;
  }
  throw std::logic_error("number of bits is unsupported");
}